

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O0

void __thiscall
nonsugar::detail::parse_flag_short<std::__cxx11::string,boost::optional<int>,void>::operator()
          (parse_flag_short<std::__cxx11::string,boost::optional<int>,void> *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              last,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *param_3,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          param_4,shared_ptr<boost::optional<int>_> *value,
          flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__d_,_boost::optional<int>_>
          *flg,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *err)

{
  bool bVar1;
  reference pcVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  element_type *v_00;
  char *s_00;
  char *s_01;
  shared_ptr<boost::optional<int>_> local_188;
  uint local_174;
  string local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  shared_ptr<int> v;
  allocator<char> local_99;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  char *local_90;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  undefined1 local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  char local_39;
  shared_ptr<boost::optional<int>_> *psStack_38;
  char name;
  shared_ptr<boost::optional<int>_> *value_local;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *param_3_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *it_local;
  parse_flag_short<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::optional<int>,_void>
  *this_local;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  param_4_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last_local;
  
  psStack_38 = value;
  value_local = (shared_ptr<boost::optional<int>_> *)param_3;
  param_3_local =
       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)it;
  it_local = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this;
  this_local = (parse_flag_short<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::optional<int>,_void>
                *)param_4._M_current;
  param_4_local._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)last._M_current;
  pcVar2 = __gnu_cxx::
           __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(it);
  local_39 = *pcVar2;
  local_48 = std::next<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                       ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )param_3_local->_M_current,1);
  bVar1 = __gnu_cxx::operator==
                    (&local_48,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&param_4_local);
  if (bVar1) {
    std::make_shared<boost::optional<int>>();
    std::shared_ptr<boost::optional<int>_>::operator=
              (psStack_38,(shared_ptr<boost::optional<int>_> *)((long)&s.field_2 + 8));
    std::shared_ptr<boost::optional<int>_>::~shared_ptr
              ((shared_ptr<boost::optional<int>_> *)((long)&s.field_2 + 8));
  }
  else {
    local_90 = (char *)param_3_local->_M_current;
    local_88 = std::next<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                         ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           )local_90,1);
    local_98._M_current = (char *)param_4_local._M_current;
    std::allocator<char>::allocator();
    std::__cxx11::string::
    string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((string *)local_80,local_88,local_98,&local_99);
    std::allocator<char>::~allocator(&local_99);
    v.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)param_4_local._M_current;
    _Var3 = std::prev<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )param_4_local._M_current,1);
    param_3_local->_M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var3._M_current;
    std::
    function<std::shared_ptr<int>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()((function<std::shared_ptr<int>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&stack0xffffffffffffff30,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flg->read);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffff30);
    if (bVar1) {
      v_00 = std::__shared_ptr_access<int,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                       ((__shared_ptr_access<int,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &stack0xffffffffffffff30);
      optional_traits<boost::optional<int>,_void>::construct(v_00);
      copy_shared<boost::optional<int>>((optional<int> *)&local_188);
      std::shared_ptr<boost::optional<int>_>::operator=(psStack_38,&local_188);
      std::shared_ptr<boost::optional<int>_>::~shared_ptr(&local_188);
    }
    else {
      widen<std::__cxx11::string>(&local_150,(detail *)"invalid argument: -",s_00);
      std::operator+(&local_130,&local_150,local_39);
      widen<std::__cxx11::string>(&local_170,(detail *)0x1ea5f5,s_01);
      std::operator+(&local_110,&local_130,&local_170);
      std::operator+(&local_f0,&local_110,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
      std::__cxx11::string::operator=((string *)err,(string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_150);
    }
    local_174 = (uint)!bVar1;
    std::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)&stack0xffffffffffffff30);
    std::__cxx11::string::~string((string *)local_80);
  }
  return;
}

Assistant:

void operator()(
        NameIterator &it, NameIterator last, Iterator &, Iterator,
        std::shared_ptr<Value> &value, Flag const &flg, String &err) const
    {
        auto const name = *it;
        if (std::next(it) == last) {
            value = std::make_shared<Value>();
        } else {
            auto const s = String(std::next(it), last);
            it = std::prev(last);
            auto const v = flg.read(s);
            if (!v) {
                err = widen<String>("invalid argument: -") + name + widen<String>(" ") + s;
                return;
            }
            value = copy_shared(optional_traits<Value>::construct(*v));
        }
    }